

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ArrayPtr<const_kj::CidrRange> kj::_::exampleAddresses(void)

{
  int iVar1;
  ArrayPtr<const_kj::CidrRange> AVar2;
  StringPtr pattern;
  StringPtr pattern_00;
  StringPtr pattern_01;
  StringPtr pattern_02;
  
  if (exampleAddresses()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&exampleAddresses()::result);
    if (iVar1 != 0) {
      pattern.content.size_ = 0xd;
      pattern.content.ptr = "192.0.2.0/24";
      CidrRange::CidrRange((CidrRange *)exampleAddresses()::result,pattern);
      pattern_00.content.size_ = 0x10;
      pattern_00.content.ptr = "198.51.100.0/24";
      CidrRange::CidrRange((CidrRange *)(exampleAddresses()::result + 0x18),pattern_00);
      pattern_01.content.size_ = 0xf;
      pattern_01.content.ptr = "203.0.113.0/24";
      CidrRange::CidrRange((CidrRange *)(exampleAddresses()::result + 0x30),pattern_01);
      pattern_02.content.size_ = 0xe;
      pattern_02.content.ptr = "2001:db8::/32";
      CidrRange::CidrRange((CidrRange *)(exampleAddresses()::result + 0x48),pattern_02);
      __cxa_guard_release(&exampleAddresses()::result);
    }
  }
  AVar2.size_ = 4;
  AVar2.ptr = (CidrRange *)exampleAddresses()::result;
  return AVar2;
}

Assistant:

ArrayPtr<const CidrRange> exampleAddresses() {
  static const CidrRange result[] = {
    "192.0.2.0/24"_kj,          // RFC5737 "example address" block 1 -- like example.com for IPs
    "198.51.100.0/24"_kj,       // RFC5737 "example address" block 2 -- like example.com for IPs
    "203.0.113.0/24"_kj,        // RFC5737 "example address" block 3 -- like example.com for IPs
    "2001:db8::/32"_kj,         // RFC3849 "example address" block -- like example.com for IPs
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents result from implicitly
  //   casting to our return type.
  return kj::arrayPtr(result, kj::size(result));
}